

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coeffarraydemo.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  int iVar1;
  FILE *this;
  double a;
  int i;
  FILE *foutput;
  FILE *finput;
  int taps;
  Fir1 fir;
  double (*in_stack_ffffffffffffff78) [50];
  Fir1 *in_stack_ffffffffffffff80;
  double local_68;
  int local_5c;
  FILE *local_58;
  FILE *local_50;
  uint local_34;
  Fir1 local_30;
  int local_4;
  
  local_4 = 0;
  Fir1::Fir1<50u>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_34 = Fir1::getTaps(&local_30);
  printf("taps = %d\n",(ulong)local_34);
  this = fopen("ecg50hz.dat","rt");
  local_50 = this;
  local_58 = fopen("ecg_filtered.dat","wt");
  local_5c = 0;
  while ((local_5c < 10000 && (iVar1 = __isoc99_fscanf(local_50,"%lf\n",&local_68), 0 < iVar1))) {
    local_68 = Fir1::filter(&local_30,local_68);
    fprintf(local_58,"%f\n",local_68);
    local_5c = local_5c + 1;
  }
  fclose(local_50);
  fclose(local_58);
  fprintf(_stderr,"Written the filtered ECG to \'ecg_filtered.dat\'\n");
  Fir1::~Fir1((Fir1 *)this);
  return local_4;
}

Assistant:

int main (int,char**)
{
	// inits the filter
	Fir1 fir(lp);

	// gets the number of taps
	int taps = fir.getTaps();

	printf("taps = %d\n",taps);

	FILE *finput = fopen("ecg50hz.dat","rt");
	FILE *foutput = fopen("ecg_filtered.dat","wt");
	for(int i=0;i<10000;i++) 
	{
		double a;
		if (fscanf(finput,"%lf\n",&a)<1) break;
		a = fir.filter(a);
		fprintf(foutput,"%f\n",a);
	}
	fclose(finput);
	fclose(foutput);
	fprintf(stderr,"Written the filtered ECG to 'ecg_filtered.dat'\n");
}